

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SamReadGroup.h
# Opt level: O0

SamReadGroup * __thiscall
BamTools::SamReadGroup::operator=(SamReadGroup *this,SamReadGroup *param_2)

{
  string *in_RSI;
  SamReadGroup *in_RDI;
  vector<BamTools::CustomHeaderTag,_std::allocator<BamTools::CustomHeaderTag>_> *unaff_retaddr;
  SamReadGroup *__x;
  
  __x = in_RDI;
  std::__cxx11::string::operator=((string *)in_RDI,in_RSI);
  std::__cxx11::string::operator=((string *)&in_RDI->FlowOrder,in_RSI + 0x20);
  std::__cxx11::string::operator=((string *)&in_RDI->ID,in_RSI + 0x40);
  std::__cxx11::string::operator=((string *)&in_RDI->KeySequence,in_RSI + 0x60);
  std::__cxx11::string::operator=((string *)&in_RDI->Library,in_RSI + 0x80);
  std::__cxx11::string::operator=((string *)&in_RDI->PlatformUnit,in_RSI + 0xa0);
  std::__cxx11::string::operator=((string *)&in_RDI->PredictedInsertSize,in_RSI + 0xc0);
  std::__cxx11::string::operator=((string *)&in_RDI->ProductionDate,in_RSI + 0xe0);
  std::__cxx11::string::operator=((string *)&in_RDI->Program,in_RSI + 0x100);
  std::__cxx11::string::operator=((string *)&in_RDI->Sample,in_RSI + 0x120);
  std::__cxx11::string::operator=((string *)&in_RDI->SequencingCenter,in_RSI + 0x140);
  std::__cxx11::string::operator=((string *)&in_RDI->SequencingTechnology,in_RSI + 0x160);
  std::vector<BamTools::CustomHeaderTag,_std::allocator<BamTools::CustomHeaderTag>_>::operator=
            (unaff_retaddr,
             (vector<BamTools::CustomHeaderTag,_std::allocator<BamTools::CustomHeaderTag>_> *)__x);
  return in_RDI;
}

Assistant:

struct API_EXPORT SamReadGroup
{

    // ctor & dtor
    SamReadGroup();
    SamReadGroup(const std::string& id);

    // query/modify entire read group
    void Clear();  // clears all data fields

    // convenience query methods
    bool HasDescription() const;          // returns true if read group has a description
    bool HasFlowOrder() const;            // returns true if read group has a flow order entry
    bool HasID() const;                   // returns true if read group has a group ID
    bool HasKeySequence() const;          // returns true if read group has a key sequence
    bool HasLibrary() const;              // returns true if read group has a library name
    bool HasPlatformUnit() const;         // returns true if read group has a platform unit ID
    bool HasPredictedInsertSize() const;  // returns true if read group has a predicted insert size
    bool HasProductionDate() const;       // returns true if read group has a production date
    bool HasProgram() const;              // returns true if read group has a program entry
    bool HasSample() const;               // returns true if read group has a sample name
    bool HasSequencingCenter() const;     // returns true if read group has a sequencing center ID
    bool HasSequencingTechnology()
        const;  // returns true if read group has a sequencing technology ID

    // data fields
    std::string Description;           // DS:<Description>
    std::string FlowOrder;             // FO:<FlowOrder>
    std::string ID;                    // ID:<ID>              *Required for valid SAM header*
    std::string KeySequence;           // KS:<KeySequence>
    std::string Library;               // LB:<Library>
    std::string PlatformUnit;          // PU:<PlatformUnit>
    std::string PredictedInsertSize;   // PI:<PredictedInsertSize>
    std::string ProductionDate;        // DT:<ProductionDate>
    std::string Program;               // PG:<Program>
    std::string Sample;                // SM:<Sample>
    std::string SequencingCenter;      // CN:<SequencingCenter>
    std::string SequencingTechnology;  // PL:<SequencingTechnology>
    std::vector<CustomHeaderTag> CustomTags;  // optional custom tags
}